

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O3

char * yajl_status_to_string(yajl_status stat)

{
  if (stat < (yajl_status_error|yajl_status_client_canceled)) {
    return &DAT_00105170 + *(int *)(&DAT_00105170 + (ulong)stat * 4);
  }
  return "unknown";
}

Assistant:

const char *
yajl_status_to_string(yajl_status stat)
{
    const char * statStr = "unknown";
    switch (stat) {
        case yajl_status_ok:
            statStr = "ok, no error";
            break;
        case yajl_status_client_canceled:
            statStr = "client canceled parse";
            break;
        case yajl_status_error:
            statStr = "parse error";
            break;
        default:
            break;
    }
    return statStr;
}